

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags,
                     ImGuiWindow *docked_window)

{
  ImGuiItemStatusFlags *pIVar1;
  short sVar2;
  int iVar3;
  uint uVar4;
  ImGuiWindow_conflict *pIVar5;
  ImGuiDockNode *pIVar6;
  ImDrawList *draw_list;
  undefined1 auVar7 [16];
  bool bVar8;
  ImGuiContext_conflict1 *ctx;
  ImGuiWindow *window;
  char *text;
  bool bVar9;
  bool bVar10;
  ImU32 id;
  int iVar11;
  ImU32 col;
  uint uVar12;
  ImGuiID close_button_id;
  ImGuiTabItem *pIVar13;
  size_t sVar14;
  undefined8 extraout_RAX;
  char *pcVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  ImGuiCol idx;
  ulong uVar20;
  long lVar21;
  ImGuiTabItem *pIVar22;
  bool is_contents_visible;
  undefined1 auVar23 [4];
  float fVar24;
  float fVar25;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar26;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar27;
  ImVec2 IVar28;
  ImVec2 IVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float local_c0;
  bool text_clipped;
  bool just_closed;
  ImGuiWindow *local_b8;
  uint local_b0;
  uint local_ac;
  ImRect bb;
  bool held;
  float local_84;
  bool hovered;
  float fStack_7c;
  undefined1 local_78 [4];
  undefined1 auStack_74 [12];
  bool *local_60;
  ImVec2 local_58;
  char *local_50;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_b8 = docked_window;
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  ctx = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  if (pIVar5->SkipItems != false) {
    return false;
  }
  id = TabBarCalcTabID(tab_bar,label,local_b8);
  if (p_open != (bool *)0x0) {
    if (*p_open == false) {
      bb.Min.x = 0.0;
      bb.Min.y = 0.0;
      bb.Max.x = 0.0;
      bb.Max.y = 0.0;
      ItemAdd(&bb,id,(ImRect *)0x0,0x18);
      return false;
    }
    if (((uint)flags >> 0x15 & 1) != 0) {
      __assert_fail("!p_open || !(flags & ImGuiTabItemFlags_Button)",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                    ,0x1f0c,
                    "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                   );
    }
  }
  if ((~flags & 0xc0U) == 0) {
    __assert_fail("(flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                  ,0x1f0d,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                 );
  }
  local_60 = (bool *)0x0;
  uVar19 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    local_60 = p_open;
    uVar19 = flags | 0x100000;
  }
  uVar20 = (ulong)uVar19;
  if (p_open != (bool *)0x0) {
    uVar20 = (ulong)(uint)flags;
  }
  IVar28 = TabItemCalcSize(label,local_60 != (bool *)0x0);
  auVar23 = (undefined1  [4])IVar28.x;
  fVar25 = IVar28.y;
  uVar19 = (tab_bar->Tabs).Size;
  uVar26 = extraout_XMM0_Dc;
  uVar27 = extraout_XMM0_Dd;
  if (0 < (int)uVar19 && id != 0) {
    pIVar13 = (tab_bar->Tabs).Data;
    lVar21 = 0;
    do {
      if (*(ImU32 *)((long)&pIVar13->ID + lVar21) == id) {
        pIVar22 = (ImGuiTabItem *)((long)&pIVar13->ID + lVar21);
        bVar9 = false;
        goto LAB_001f3214;
      }
      lVar21 = lVar21 + 0x30;
    } while ((ulong)uVar19 * 0x30 != lVar21);
  }
  if (uVar19 == (tab_bar->Tabs).Capacity) {
    auStack_74._4_4_ = extraout_XMM0_Dc;
    local_78 = (undefined1  [4])IVar28.x;
    auStack_74._0_4_ = IVar28.y;
    auStack_74._8_4_ = extraout_XMM0_Dd;
    if (uVar19 == 0) {
      iVar16 = 8;
    }
    else {
      iVar16 = (int)uVar19 / 2 + uVar19;
    }
    iVar18 = uVar19 + 1;
    if ((int)(uVar19 + 1) < iVar16) {
      iVar18 = iVar16;
    }
    pIVar13 = (ImGuiTabItem *)MemAlloc((long)iVar18 * 0x30);
    pIVar22 = (tab_bar->Tabs).Data;
    if (pIVar22 != (ImGuiTabItem *)0x0) {
      memcpy(pIVar13,pIVar22,(long)(tab_bar->Tabs).Size * 0x30);
      MemFree((tab_bar->Tabs).Data);
    }
    (tab_bar->Tabs).Data = pIVar13;
    (tab_bar->Tabs).Capacity = iVar18;
    uVar19 = (tab_bar->Tabs).Size;
    auVar23 = local_78;
    fVar25 = (float)auStack_74._0_4_;
    uVar26 = auStack_74._4_4_;
    uVar27 = auStack_74._8_4_;
  }
  else {
    pIVar13 = (tab_bar->Tabs).Data;
  }
  pIVar22 = pIVar13 + (int)uVar19;
  pIVar22->ID = 0;
  pIVar22->Flags = 0;
  pIVar22->Window = (ImGuiWindow *)0x0;
  pIVar13[(int)uVar19].LastFrameVisible = -1;
  pIVar13[(int)uVar19].LastFrameSelected = -1;
  pIVar13[(int)uVar19].ContentWidth = 0.0;
  pIVar13[(int)uVar19].Offset = 0.0;
  pIVar13[(int)uVar19].Width = 0.0;
  pIVar22 = pIVar13 + (int)uVar19;
  pIVar22->NameOffset = -1;
  pIVar22->BeginOrder = -1;
  pIVar22->IndexDuringLayout = -1;
  *(undefined4 *)&pIVar13[(int)uVar19].WantClose = 0;
  iVar16 = (tab_bar->Tabs).Size;
  uVar19 = iVar16 + 1;
  (tab_bar->Tabs).Size = uVar19;
  if (iVar16 < 0) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                  ,0x70f,"T &ImVector<ImGuiTabItem>::back() [T = ImGuiTabItem]");
  }
  pIVar13 = (tab_bar->Tabs).Data;
  pIVar22 = pIVar13 + ((ulong)uVar19 - 1);
  pIVar22->ID = id;
  pIVar13[(ulong)uVar19 - 1].Width = (float)auVar23;
  tab_bar->TabsAddedNew = true;
  bVar9 = true;
LAB_001f3214:
  local_50 = label;
  if ((pIVar22 < pIVar13) || (pIVar13 + (int)uVar19 <= pIVar22)) {
    __assert_fail("it >= Data && it < Data + Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                  ,0x726,
                  "int ImVector<ImGuiTabItem>::index_from_ptr(const T *) const [T = ImGuiTabItem]");
  }
  tab_bar->LastTabItemIdx = (short)((uint)((int)pIVar22 - (int)pIVar13) >> 4) * -0x5555;
  pIVar22->ContentWidth = (float)auVar23;
  sVar2 = tab_bar->TabsActiveCount;
  tab_bar->TabsActiveCount = sVar2 + 1;
  pIVar22->BeginOrder = sVar2;
  uVar19 = tab_bar->Flags;
  iVar16 = tab_bar->PrevFrameVisible;
  iVar18 = ctx->FrameCount;
  iVar17 = pIVar22->LastFrameVisible;
  pIVar22->LastFrameVisible = iVar18;
  pIVar22->Flags = (uint)uVar20;
  pIVar22->Window = local_b8;
  if (local_b8 == (ImGuiWindow *)0x0) {
    iVar3 = (tab_bar->TabsNames).Buf.Size;
    iVar11 = iVar3 + -1;
    if (iVar3 == 0) {
      iVar11 = 0;
    }
    pIVar22->NameOffset = iVar11;
    auStack_74._0_4_ = fVar25;
    local_78 = auVar23;
    auStack_74._4_4_ = uVar26;
    auStack_74._8_4_ = uVar27;
    local_b0 = uVar19;
    local_ac = (uint)uVar20;
    sVar14 = strlen(label);
    uVar20 = (ulong)local_ac;
    ImGuiTextBuffer::append(&tab_bar->TabsNames,label,label + sVar14 + 1);
    fVar25 = (float)auStack_74._0_4_;
    uVar19 = local_b0;
  }
  else {
    if ((uVar19 >> 0x14 & 1) == 0) {
      __assert_fail("tab_bar->Flags & ImGuiTabBarFlags_DockNode",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                    ,0x1f34,
                    "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                   );
    }
    pIVar22->NameOffset = -1;
  }
  iVar16 = iVar16 + 1;
  iVar17 = iVar17 + 1;
  uVar12 = (uint)uVar20;
  if (((iVar17 < iVar18) && ((tab_bar->Flags & 2) != 0)) && (tab_bar->NextSelectedTabId == 0)) {
    if (iVar16 < iVar18) {
      if ((uVar20 & 0x200000) == 0 && tab_bar->SelectedTabId == 0) {
LAB_001f3347:
        tab_bar->NextSelectedTabId = id;
      }
    }
    else if ((uVar12 >> 0x15 & 1) == 0) goto LAB_001f3347;
  }
  if ((((uVar20 & 2) != 0) && (tab_bar->SelectedTabId != id)) && ((uVar20 & 0x200000) == 0)) {
    tab_bar->NextSelectedTabId = id;
  }
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    is_contents_visible = true;
  }
  else {
    is_contents_visible = false;
    if (((tab_bar->SelectedTabId == 0) && (local_b8 == (ImGuiWindow *)0x0)) && (iVar16 < iVar18)) {
      if ((tab_bar->Tabs).Size == 1) {
        is_contents_visible = (tab_bar->Flags & 2) == 0;
      }
      else {
        is_contents_visible = false;
      }
    }
  }
  if ((iVar17 < iVar18) && (bVar9 || iVar18 <= iVar16)) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0,0x18);
    return (bool)((uVar12 >> 0x15 & 1) == 0 & is_contents_visible);
  }
  if (tab_bar->SelectedTabId == id) {
    pIVar22->LastFrameSelected = ctx->FrameCount;
  }
  uVar4 = pIVar22->Flags;
  fVar24 = pIVar22->Width;
  fVar32 = pIVar22->Offset;
  if ((uVar4 & 0xc0) == 0) {
    fVar32 = (float)(int)(fVar32 - tab_bar->ScrollingAnim);
  }
  bb.Min.x = fVar32 + (tab_bar->BarRect).Min.x;
  local_58 = (pIVar5->DC).CursorPos;
  bb.Min.y = (tab_bar->BarRect).Min.y + 0.0;
  IVar28.y = bb.Min.y;
  IVar28.x = bb.Min.x;
  (pIVar5->DC).CursorPos = IVar28;
  fVar24 = fVar24 + bb.Min.x;
  fVar25 = fVar25 + bb.Min.y;
  bb.Max.y = fVar25;
  bb.Max.x = fVar24;
  local_b0 = uVar19;
  if ((uVar4 & 0xc0) == 0) {
    fVar32 = tab_bar->ScrollingRectMinX;
    if ((fVar32 <= bb.Min.x) && (fVar24 <= tab_bar->ScrollingRectMaxX)) goto LAB_001f3452;
    fStack_7c = bb.Min.y + -1.0;
    _hovered = (float)(~-(uint)(fVar32 <= bb.Min.x) & (uint)fVar32 |
                      (uint)bb.Min.x & -(uint)(fVar32 <= bb.Min.x));
    _held = tab_bar->ScrollingRectMaxX;
    local_84 = fVar25;
    PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
    fVar24 = bb.Max.x;
    fVar25 = bb.Max.y;
    local_78 = (undefined1  [4])(int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  }
  else {
LAB_001f3452:
    auVar7._12_4_ = 0;
    auVar7._0_12_ = auStack_74;
    _local_78 = auVar7 << 0x20;
  }
  IVar28 = (pIVar5->DC).CursorMaxPos;
  fStack_7c = fVar25 - bb.Min.y;
  _hovered = fVar24 - bb.Min.x;
  ItemSize((ImVec2 *)&hovered,(ctx->Style).FramePadding.y);
  (pIVar5->DC).CursorMaxPos = IVar28;
  bVar9 = ItemAdd(&bb,id,(ImRect *)0x0,0);
  if (!bVar9) {
    if (local_78[0] != '\0') {
      PopClipRect();
    }
    (pIVar5->DC).CursorPos = local_58;
    return is_contents_visible;
  }
  uVar19 = ((uint)(uVar20 >> 0x11) & 0x10) + 0x1010;
  if (ctx->DragDropActive == true) {
    if ((ctx->DragDropPayload).DataFrameCount == -1) {
      uVar19 = uVar19 | 0x200;
    }
    else {
      iVar16 = strcmp("_IMWINDOW",(ctx->DragDropPayload).DataType);
      if (iVar16 != 0) {
        uVar19 = uVar19 | 0x200;
      }
    }
  }
  local_ac = uVar12;
  bVar9 = ButtonBehavior(&bb,id,&hovered,&held,uVar19);
  uVar19 = local_ac;
  if ((uVar12 >> 0x15 & 1) == 0 && bVar9) {
    tab_bar->NextSelectedTabId = id;
  }
  if ((ctx->ActiveId == id & local_b8 != (ImGuiWindow *)0x0 & held) == 1) {
    if (ctx->ActiveIdIsJustActivated == true) {
      ctx->ActiveIdWindow = (ImGuiWindow_conflict *)local_b8;
    }
LAB_001f3667:
    pIVar6 = local_b8->DockNode;
    if (((((pIVar6 == (ImGuiDockNode *)0x0) || (pIVar6->ParentNode != (ImGuiDockNode *)0x0)) ||
         ((pIVar6->MergedFlags & 0x400U) != 0)) || ((held != true || ((pIVar6->Windows).Size != 1)))
        ) || (bVar10 = IsMouseDragging(0,0.0), !bVar10)) goto LAB_001f36b3;
    StartMouseMovingWindow((ImGuiWindow_conflict *)local_b8);
  }
  else {
    if (ctx->ActiveId != id) {
      SetItemAllowOverlap();
    }
    if (local_b8 != (ImGuiWindow *)0x0) goto LAB_001f3667;
LAB_001f36b3:
    if (((held == true) && (iVar18 <= iVar17)) && (bVar10 = IsMouseDragging(0,-1.0), bVar10)) {
      if (ctx->DragDropActive != false) goto LAB_001f36f9;
      if ((local_b8 == (ImGuiWindow *)0x0) && ((tab_bar->Flags & 1U) == 0)) goto LAB_001f3962;
      fVar25 = (ctx->IO).MouseDelta.x;
      if (0.0 <= fVar25) {
LAB_001f3899:
        if (0.0 < fVar25) {
          local_c0 = (ctx->IO).MousePos.x;
          if (bb.Max.x < local_c0) {
            local_c0 = local_c0 - bb.Max.x;
            bVar8 = true;
            bVar10 = false;
            goto LAB_001f38d9;
          }
        }
LAB_001f36f9:
        local_c0 = 0.0;
        bVar10 = false;
        bVar8 = false;
      }
      else {
        local_c0 = (ctx->IO).MousePos.x;
        if (bb.Min.x <= local_c0) goto LAB_001f3899;
        local_c0 = bb.Min.x - local_c0;
        bVar10 = true;
        bVar8 = false;
LAB_001f38d9:
        TabBarQueueReorderFromMousePos(tab_bar,pIVar22,(ctx->IO).MousePos);
      }
      if ((local_b8 != (ImGuiWindow *)0x0) && ((local_b8->Flags & 4) == 0)) {
        if ((ctx->DragDropActive != true) || ((ctx->DragDropPayload).SourceId != id)) {
          fVar25 = ctx->FontSize;
          fVar32 = (ABS((ctx->IO).MouseDragMaxDistanceAbs[0].x) - (fVar25 + fVar25)) * 0.2;
          fVar24 = fVar25 * 4.0;
          if (fVar32 <= fVar25 * 4.0) {
            fVar24 = fVar32;
          }
          fVar31 = (ctx->IO).MousePos.y;
          fVar30 = bb.Min.y - fVar31;
          fVar31 = fVar31 - bb.Max.y;
          uVar12 = -(uint)(fVar31 <= fVar30);
          fVar31 = (float)(~uVar12 & (uint)fVar31 | (uint)fVar30 & uVar12);
          if (fVar25 * 2.2 < local_c0) {
            uStack_44 = 0;
            uStack_40 = 0;
            uStack_3c = 0;
            local_48 = fVar31;
            if (((bVar10) && (iVar16 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar22), iVar16 == 0)) ||
               ((fVar31 = local_48, bVar8 &&
                (iVar16 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar22), fVar31 = local_48,
                iVar16 == (tab_bar->Tabs).Size + -1)))) goto LAB_001f38fc;
          }
          if (fVar31 < fVar25 * 1.5 + (float)(~-(uint)(fVar32 < 0.0) & (uint)fVar24))
          goto LAB_001f3962;
        }
LAB_001f38fc:
        window = local_b8;
        DockContextQueueUndockWindow(ctx,(ImGuiWindow_conflict *)local_b8);
        ctx->MovingWindow = (ImGuiWindow_conflict *)window;
        SetActiveID(window->MoveId,(ImGuiWindow_conflict *)window);
        IVar28 = ctx->MovingWindow->Pos;
        IVar29.x = (ctx->ActiveIdClickOffset).x - (IVar28.x - bb.Min.x);
        IVar29.y = (ctx->ActiveIdClickOffset).y - (IVar28.y - bb.Min.y);
        ctx->ActiveIdClickOffset = IVar29;
        ctx->ActiveIdNoClearOnFocusLoss = true;
        SetActiveIdUsingNavAndKeys();
      }
    }
  }
LAB_001f3962:
  draw_list = pIVar5->DrawList;
  idx = 0x22;
  if ((held == false) && (hovered == false)) {
    if (is_contents_visible == false) {
      idx = (uint)((local_b0 >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((local_b0 >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  TabItemBackground(draw_list,&bb,uVar19,col);
  RenderNavHighlight(&bb,id,1);
  bVar10 = IsItemHovered(0x20);
  if (bVar10) {
    bVar10 = IsMouseClicked(1,false);
    if (bVar10) {
      uVar12 = uVar19 >> 0x15 & 1;
    }
    else {
      bVar10 = IsMouseReleased(1);
      if (!bVar10) goto LAB_001f3a26;
      uVar12 = uVar19 & 0x200000;
    }
    if (uVar12 == 0) {
      tab_bar->NextSelectedTabId = id;
    }
  }
LAB_001f3a26:
  uVar12 = tab_bar->Flags;
  if (local_60 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = GetIDWithSeed("#CLOSE",(char *)0x0,id);
  }
  text = local_50;
  TabItemLabelAndCloseButton
            (draw_list,&bb,uVar12 >> 1 & 4 | uVar19,tab_bar->FramePadding,local_50,id,
             close_button_id,is_contents_visible,&just_closed,&text_clipped);
  if ((local_60 != (bool *)0x0) && (just_closed != false)) {
    *local_60 = false;
    TabBarCloseTab(tab_bar,pIVar22);
  }
  if ((local_b8 != (ImGuiWindow *)0x0) &&
     ((hovered != false || (ctx->HoveredId == close_button_id)))) {
    pIVar1 = &(ctx->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 0x80;
  }
  if (local_78[0] != '\0') {
    PopClipRect();
  }
  (pIVar5->DC).CursorPos = local_58;
  if ((((text_clipped == true) && (ctx->HoveredId == id)) && (held == false)) &&
     (((ctx->TooltipSlowDelay <= ctx->HoveredIdNotActiveTimer &&
        ctx->HoveredIdNotActiveTimer != ctx->TooltipSlowDelay && (bVar10 = IsItemHovered(0), bVar10)
       ) && (((tab_bar->Flags & 0x20) == 0 && ((pIVar22->Flags & 0x10) == 0)))))) {
    pcVar15 = FindRenderedTextEnd(text,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar15 - (int)text),text);
  }
  if (((local_ac >> 0x15 & 1) != 0) &&
     (is_contents_visible = bVar9, tab_bar->SelectedTabId == pIVar22->ID)) {
    __assert_fail("!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                  ,0x2006,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                 );
  }
  return is_contents_visible;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags, ImGuiWindow* docked_window)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label, docked_window);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags);
    if (p_open && !*p_open)
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus);
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_bar->TabsAddedNew = true;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;
    tab->Window = docked_window;

    // Append name with zero-terminator
    // (regular tabs are permitted in a DockNode tab bar, but window tabs not permitted in a non-DockNode tab bar)
    if (tab->Window != NULL)
    {
        IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_DockNode);
        tab->NameOffset = -1;
    }
    else
    {
        IM_ASSERT(tab->Window == NULL);
        tab->NameOffset = (ImS32)tab_bar->TabsNames.size();
        tab_bar->TabsNames.append(label, label + strlen(label) + 1); // Append name _with_ the zero-terminator.
    }

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            if (!is_tab_button)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing && docked_window == NULL)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus);
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & ImGuiTabItemFlags_SectionMask_) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive && !g.DragDropPayload.IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW)) // FIXME: May be an opt-in property of the payload to disable this
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;

    // Transfer active id window so the active id is not owned by the dock host (as StartMouseMovingWindow()
    // will only do it on the drag). This allows FocusWindow() to be more conservative in how it clears active id.
    if (held && docked_window && g.ActiveId == id && g.ActiveIdIsJustActivated)
        g.ActiveIdWindow = docked_window;

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    // Drag and drop a single floating window node moves it
    ImGuiDockNode* node = docked_window ? docked_window->DockNode : NULL;
    const bool single_floating_window_node = node && node->IsFloatingNode() && (node->Windows.Size == 1);
    if (held && single_floating_window_node && IsMouseDragging(0, 0.0f))
    {
        // Move
        StartMouseMovingWindow(docked_window);
    }
    else if (held && !tab_appearing && IsMouseDragging(0))
    {
        // Drag and drop: re-order tabs
        int drag_dir = 0;
        float drag_distance_from_edge_x = 0.0f;
        if (!g.DragDropActive && ((tab_bar->Flags & ImGuiTabBarFlags_Reorderable) || (docked_window != NULL)))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                drag_dir = -1;
                drag_distance_from_edge_x = bb.Min.x - g.IO.MousePos.x;
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                drag_dir = +1;
                drag_distance_from_edge_x = g.IO.MousePos.x - bb.Max.x;
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
        }

        // Extract a Dockable window out of it's tab bar
        if (docked_window != NULL && !(docked_window->Flags & ImGuiWindowFlags_NoMove))
        {
            // We use a variable threshold to distinguish dragging tabs within a tab bar and extracting them out of the tab bar
            bool undocking_tab = (g.DragDropActive && g.DragDropPayload.SourceId == id);
            if (!undocking_tab) //&& (!g.IO.ConfigDockingWithShift || g.IO.KeyShift)
            {
                float threshold_base = g.FontSize;
                float threshold_x = (threshold_base * 2.2f);
                float threshold_y = (threshold_base * 1.5f) + ImClamp((ImFabs(g.IO.MouseDragMaxDistanceAbs[0].x) - threshold_base * 2.0f) * 0.20f, 0.0f, threshold_base * 4.0f);
                //GetForegroundDrawList()->AddRect(ImVec2(bb.Min.x - threshold_x, bb.Min.y - threshold_y), ImVec2(bb.Max.x + threshold_x, bb.Max.y + threshold_y), IM_COL32_WHITE); // [DEBUG]

                float distance_from_edge_y = ImMax(bb.Min.y - g.IO.MousePos.y, g.IO.MousePos.y - bb.Max.y);
                if (distance_from_edge_y >= threshold_y)
                    undocking_tab = true;
                if (drag_distance_from_edge_x > threshold_x)
                    if ((drag_dir < 0 && tab_bar->GetTabOrder(tab) == 0) || (drag_dir > 0 && tab_bar->GetTabOrder(tab) == tab_bar->Tabs.Size - 1))
                        undocking_tab = true;
            }

            if (undocking_tab)
            {
                // Undock
                // FIXME: refactor to share more code with e.g. StartMouseMovingWindow
                DockContextQueueUndockWindow(&g, docked_window);
                g.MovingWindow = docked_window;
                SetActiveID(g.MovingWindow->MoveId, g.MovingWindow);
                g.ActiveIdClickOffset -= g.MovingWindow->Pos - bb.Min;
                g.ActiveIdNoClearOnFocusLoss = true;
                SetActiveIdUsingNavAndKeys();
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > TOOLTIP_DELAY && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Forward Hovered state so IsItemHovered() after Begin() can work (even though we are technically hovering our parent)
    // That state is copied to window->DockTabItemStatusFlags by our caller.
    if (docked_window && (hovered || g.HoveredId == close_button_id))
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredWindow;

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip
    // (Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer-> seems ok)
    // (We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar, which g.HoveredId ignores)
    // FIXME: This is a mess.
    // FIXME: We may want disabled tab to still display the tooltip?
    if (text_clipped && g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}